

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

int __thiscall chrono::ChLinkMask::GetMaskDoc(ChLinkMask *this)

{
  pointer ppCVar1;
  int iVar2;
  long lVar3;
  
  if (0 < (long)this->nconstr) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      ppCVar1 = (this->constraints).
                super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar3;
      lVar3 = lVar3 + 1;
      iVar2 = iVar2 + (uint)((*ppCVar1)->super_ChConstraintTwo).super_ChConstraint.active;
    } while (this->nconstr != lVar3);
    return iVar2;
  }
  return 0;
}

Assistant:

int ChLinkMask::GetMaskDoc() {
    int tot = 0;
    for (int j = 0; j < nconstr; j++) {
        if (Constr_N(j).IsActive())
            tot++;
    }
    return tot;
}